

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convTest.c
# Opt level: O0

void main(void)

{
  int iVar1;
  float *data2;
  void *__ptr;
  double dVar2;
  int in_stack_ffffffffffffff98;
  uint __seed;
  int rannum;
  uint randseed;
  FILE *fdataout;
  long M;
  long TheErr;
  long i2;
  long i1;
  float *b;
  float *a;
  long dataSize;
  long kernSize;
  long N;
  long N2;
  
  N = 2;
  kernSize = 0x800;
  dataSize = 0x3eb;
  a = (float *)0x416;
  __seed = 0x309;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",(ulong)__seed);
  srand(__seed);
  dVar2 = log((double)kernSize);
  data2 = (float *)lround(dVar2 * 1.4426950408889634);
  kernSize = 1L << ((byte)data2 & 0x3f);
  printf("fft size = %6ld,  ",kernSize);
  if ((long)a < 1) {
    M = 0x16;
  }
  else {
    M = 0;
  }
  if (M == 0) {
    iVar1 = fftInit(0);
    M = (long)iVar1;
  }
  __ptr = calloc(kernSize << 1,4);
  if (__ptr == (void *)0x0) {
    M = 2;
  }
  if ((M == 0) && (i1 = (long)calloc(kernSize << 1,4), (void *)i1 == (void *)0x0)) {
    M = 2;
  }
  if ((M == 0) && (_rannum = fopen("convdat.cnv","wb"), _rannum == (FILE *)0x0)) {
    M = -0x32;
  }
  if (M == 0) {
    fwrite(&a,8,1,_rannum);
    fwrite(&dataSize,8,1,_rannum);
    fwrite(&N,8,1,_rannum);
    for (TheErr = 0; TheErr < 2; TheErr = TheErr + 1) {
      for (i2 = 0; i2 < (long)a; i2 = i2 + 1) {
        in_stack_ffffffffffffff98 = rand();
        *(float *)((long)__ptr + (TheErr * kernSize + i2) * 4) =
             (float)in_stack_ffffffffffffff98 * 9.313226e-10 + -1.0;
      }
      fwrite((void *)((long)__ptr + TheErr * kernSize * 4),(long)a << 2,1,_rannum);
    }
    for (TheErr = 0; TheErr < 2; TheErr = TheErr + 1) {
      for (i2 = 0; i2 < dataSize; i2 = i2 + 1) {
        in_stack_ffffffffffffff98 = rand();
        *(float *)(i1 + (TheErr * kernSize + i2) * 4) =
             (float)in_stack_ffffffffffffff98 * 9.313226e-10 + -1.0;
      }
      fwrite((void *)(i1 + TheErr * kernSize * 4),dataSize << 2,1,_rannum);
    }
    rffts((float *)0x0,(long)data2,(long)_rannum);
    rffts((float *)0x0,(long)data2,(long)_rannum);
    for (TheErr = 0; SBORROW8(TheErr,kernSize * 2) != TheErr + kernSize * -2 < 0;
        TheErr = kernSize + TheErr) {
      rspectprod((float *)0x0,data2,(float *)_rannum,CONCAT44(__seed,in_stack_ffffffffffffff98));
    }
    riffts((float *)0x0,(long)data2,(long)_rannum);
    fwrite(__ptr,kernSize << 3,1,_rannum);
    fclose(_rannum);
    free((void *)i1);
    free(__ptr);
    fftFree();
  }
  else {
    if (M == 2) {
      printf(" out of memory \n");
    }
    else {
      printf(" error \n");
    }
    fftFree();
  }
  printf(" Done. \n");
  return;
}

Assistant:

void main(){
const long N2 = 2;		/* the number ffts to test */
long 	N = 2048;		/* size of FFTs, must be power of 2 */
long 	kernSize = 1003;	/* kernal size must be less than N */
long 	dataSize = N-kernSize+1;	/* data size */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);

printf("fft size = %6ld,  ",  N);

if (dataSize <= 0) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fftInit(M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("convdat.cnv", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&N2, sizeof(N2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<N2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}


	/* fast convolution of zero padded sequences */
	rffts(a, M, N2);
	rffts(b, M, N2);
	for (i2=0; i2<N2*N; i2+=N){
		rspectprod(&a[i2], &b[i2], &a[i2], N);
	}
	riffts(a, M, N2);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fftFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fftFree();
}
printf(" Done. \n");
return;
}